

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  Reg RVar9;
  uint uVar10;
  MCode MVar4;
  uint uVar5;
  MCode *pMVar6;
  byte bVar7;
  Reg src;
  MCode *pMVar8;
  long lVar11;
  RegSet drop;
  IRIns *ir_00;
  bool bVar12;
  
  if (*(char *)((long)ir + 0xd) == '\x10') {
    bVar12 = (*(byte *)((long)ir + 0xc) & 0x1f) != 0;
  }
  else {
    bVar12 = false;
  }
  bVar3 = (ir->field_1).r & 0x1f;
  uVar10 = 0xffff0fc7;
  if (-1 < (char)(ir->field_1).r) {
    uVar10 = -2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3;
  }
  drop = uVar10 & (uint)((*(byte *)((long)&ci->flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  if ((bVar12) && (-1 < *(char *)((long)ir + 0xe))) {
    drop = drop & ~(1 << ((int)*(char *)((long)ir + 0xe) & 0x1fU));
  }
  ra_evictset(as,drop);
  bVar3 = (ir->field_1).r;
  RVar9 = (Reg)bVar3;
  if (((char)bVar3 < '\0') && ((ir->field_1).s == '\0')) {
    return;
  }
  bVar7 = (ir->field_1).t.irt & 0x1f;
  if ((byte)(bVar7 - 0xd) < 2) {
    if ((ci->flags & 0x200) != 0) {
      bVar7 = (ir->field_1).s;
      if (-1 < (char)bVar3) {
        uVar10 = 1 << (bVar3 & 0x1f);
        as->freeset = as->freeset | uVar10;
        as->modset = as->modset | uVar10;
        pMVar6 = as->mcp;
        pMVar6[-1] = bVar3 * '\b' | 0xc0;
        pMVar6[-5] = 0xfc;
        pMVar6[-4] = 'f';
        pMVar6[-3] = '\x0f';
        pMVar6[-2] = 'n';
        pMVar6[-4] = bVar3 >> 1 & 4 | 0x48;
        pMVar6[-5] = 'f';
        as->mcp = pMVar6 + -5;
      }
      if (bVar7 == 0) {
        return;
      }
      pMVar6 = as->mcp;
      if (bVar7 < 0x20) {
        pMVar6[-1] = (MCode)((uint)bVar7 << 2);
        MVar4 = 'D';
        lVar11 = -1;
      }
      else {
        *(uint *)(pMVar6 + -4) = (uint)bVar7 << 2;
        MVar4 = 0x84;
        lVar11 = -4;
      }
      pMVar8 = pMVar6 + lVar11 + -4;
      pMVar6[lVar11 + -1] = '$';
      pMVar6[lVar11 + -2] = MVar4;
      pMVar8[0] = 'H';
      pMVar8[1] = 0x89;
      as->mcp = pMVar8;
      return;
    }
    RVar9 = 0x10;
LAB_00140226:
    ra_destreg(as,ir,RVar9);
    return;
  }
  if (!bVar12) {
    RVar9 = 0;
    goto LAB_00140226;
  }
  bVar1 = *(byte *)((long)ir + 0xe);
  uVar10 = (uint)bVar1;
  if ((bVar1 != 0 && bVar3 != 0) && (as->freeset & 1) == 0) {
    ra_restore(as,(uint)(ushort)as->cost[0]);
  }
  if ((bVar3 != 2 && (as->freeset & 4) == 0) && bVar1 != 2) {
    ra_restore(as,(uint)(ushort)as->cost[2]);
  }
  if ((char)bVar3 < '\0') {
    RVar9 = 0;
  }
  else {
    uVar5 = 1 << (bVar3 & 0x1f);
    as->freeset = as->freeset | uVar5;
    as->modset = as->modset | uVar5;
  }
  if ((char)bVar1 < '\0') {
    uVar10 = 2;
  }
  else {
    uVar5 = 1 << (bVar1 & 0x1f);
    as->freeset = as->freeset | uVar5;
    as->modset = as->modset | uVar5;
  }
  ir_00 = (IRIns *)((ulong)(~(uint)(0x302fec8L >> bVar7) & 8) + (long)ir);
  if (RVar9 == 2) {
    if (uVar10 == 0) {
      pMVar6 = as->mcp;
      as->mcp = pMVar6 + -1;
      pMVar6[-1] = 0x92;
      uVar5._0_2_ = *(IROpT *)((long)ir_00 + 4);
      uVar5._2_2_ = *(IRRef1 *)((long)ir_00 + 6);
      if ((0x605fd9U >> (uVar5 & 0x1f) & 1) != 0) {
        pMVar6 = as->mcp;
        as->mcp = pMVar6 + -1;
        pMVar6[-1] = 'H';
      }
      goto LAB_00140388;
    }
    emit_movrr(as,ir_00,2,0);
    if (uVar10 == 2) goto LAB_00140388;
    src = 2;
    RVar9 = uVar10;
  }
  else {
    if (uVar10 != 2) {
      if (uVar10 == 0) {
        uVar10._0_2_ = *(IROpT *)((long)ir_00 + 4);
        uVar10._2_2_ = *(IRRef1 *)((long)ir_00 + 6);
        uVar10 = -(uint)((0x605fd9U >> (uVar10 & 0x1f) & 1) != 0) & 0x80200;
        pMVar6 = as->mcp;
        pMVar6[-2] = 0x8b;
        pMVar6[-1] = 0xc2;
        if ((short)uVar10 == 0) {
          pMVar6 = pMVar6 + -2;
        }
        else {
          pMVar6[-3] = (byte)(uVar10 >> 0x10) | 0x40;
          pMVar6 = pMVar6 + -3;
        }
        as->mcp = pMVar6;
      }
      else {
        emit_movrr(as,ir_00,uVar10,2);
      }
    }
    if (RVar9 == 0) goto LAB_00140388;
    src = 0;
  }
  emit_movrr(as,ir_00,RVar9,src);
LAB_00140388:
  if (*(byte *)((long)ir + 0xf) != 0) {
    RVar9 = 0x80202;
    if ((0x605fd9U >> (*(uint *)((long)ir + 0xc) & 0x1f) & 1) == 0) {
      RVar9 = 2;
    }
    emit_rmro(as,XO_MOVto,RVar9,4,(uint)*(byte *)((long)ir + 0xf) << 2);
  }
  if ((ir->field_1).s == 0) {
    return;
  }
  uVar2._0_2_ = *(IROpT *)((long)ir + 4);
  uVar2._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rmro(as,XO_MOVto,-(uint)((0x605fd9U >> (uVar2 & 0x1f) & 1) != 0) & 0x80200,4,
            (uint)(ir->field_1).s << 2);
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = ((ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
    } else if (hiop) {
      ra_destpair(as, ir);
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}